

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

int64_t __thiscall duckdb::timestamp_t::operator-(timestamp_t *this,timestamp_t *other)

{
  bool bVar1;
  OutOfRangeException *this_00;
  int64_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TrySubtractOperator::Operation<long,long,long>(this->value,other->value,&local_48);
  if (bVar1) {
    return local_48;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Overflow in timestamp subtraction","");
  OutOfRangeException::OutOfRangeException(this_00,&local_40);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t timestamp_t::operator-(const timestamp_t &other) const {
	int64_t result;
	if (!TrySubtractOperator::Operation(value, int64_t(other.value), result)) {
		throw OutOfRangeException("Overflow in timestamp subtraction");
	}
	return result;
}